

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::MpMap<true>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  ushort uVar1;
  uint uVar2;
  ulong uVar3;
  byte bVar4;
  uint uVar5;
  FieldEntry *pFVar6;
  void *x;
  MapFieldBaseForParse *pMVar7;
  UntypedMapBase *this;
  NodeBase *pNVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ptr_00;
  char *pcVar9;
  byte local_80;
  byte local_74;
  
  pFVar6 = RefAt<google::protobuf::internal::TcParseTableBase::FieldEntry>
                     (table,(ulong)data.field_0 >> 0x20);
  uVar1 = pFVar6->aux_idx;
  uVar2 = table->aux_offset;
  uVar3 = *(ulong *)((long)&table->has_bits_offset + (ulong)uVar1 * 8 + (ulong)uVar2);
  if ((((uint)uVar3 >> 0x10 & 1) == 0) || ((data.field_0._0_4_ & 7) != 2)) {
    pcVar9 = MpFallback(msg,ptr,ctx,data,table,hasbits);
    return pcVar9;
  }
  x = MaybeGetSplitBase(msg,true,table);
  if ((uVar3 >> 0x10 & 2) == 0) {
    pMVar7 = RefAt<google::protobuf::internal::MapFieldBaseForParse>(x,(ulong)pFVar6->offset);
    this = (*pMVar7->vtable_->get_map)(pMVar7,true);
  }
  else {
    this = RefAt<google::protobuf::internal::UntypedMapBase>(x,(ulong)pFVar6->offset);
  }
  bVar4 = (byte)((uVar3 & 0xffffffff) >> 3);
  uVar5 = (uint)uVar3 >> 0xb;
  local_74 = (byte)uVar5 & 7;
  local_80 = bVar4 & 7;
  pNVar8 = UntypedMapBase::AllocNode(this,(MapNodeSizeInfoT)(uVar3 >> 0x20));
  if (local_80 < 5) {
    ptr_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(pNVar8 + 1);
    switch(bVar4 & 7) {
    case 0:
      *(undefined1 *)&(ptr_00->_M_dataplus)._M_p = 0;
      break;
    case 1:
      *(undefined4 *)&(ptr_00->_M_dataplus)._M_p = 0;
      break;
    case 2:
      (ptr_00->_M_dataplus)._M_p = (pointer)0x0;
      break;
    case 3:
      Arena::CreateInArenaStorage<std::__cxx11::string>(ptr_00,(this->alloc_).arena_);
      break;
    case 4:
      ClassData::PlacementNew
                (*(ClassData **)
                  (*(long *)(&table->fast_idx_mask + (ulong)uVar1 * 8 + (ulong)uVar2) + 0x20),ptr_00
                 ,(this->alloc_).arena_);
    }
    if (local_74 < 5) {
      pcVar9 = (char *)(*(code *)(&DAT_003a67a0 +
                                 *(int *)(&DAT_003a67a0 + ((ulong)(uVar5 & 0xff) & 7) * 4)))();
      return pcVar9;
    }
  }
  Unreachable("/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_lite.cc"
              ,0x9e9);
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::MpMap(PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  // `aux[0]` points into a MapAuxInfo.
  // If we have a message mapped_type aux[1] points into a `create_in_arena`.
  // If we have a validated enum mapped_type aux[1] point into a
  // `enum_data`.
  const auto* aux = table->field_aux(&entry);
  const auto map_info = aux[0].map_info;

  if (PROTOBUF_PREDICT_FALSE(!map_info.is_supported ||
                             (data.tag() & 7) !=
                                 WireFormatLite::WIRETYPE_LENGTH_DELIMITED)) {
    PROTOBUF_MUSTTAIL return MpFallback(PROTOBUF_TC_PARAM_PASS);
  }

  // When using LITE, the offset points directly into the Map<> object.
  // Otherwise, it points into a MapField and we must synchronize with
  // reflection. It is done by calling the MutableMap() virtual function on the
  // field's base class.
  void* const base = MaybeGetSplitBase(msg, is_split, table);
  UntypedMapBase& map =
      map_info.use_lite
          ? RefAt<UntypedMapBase>(base, entry.offset)
          : *RefAt<MapFieldBaseForParse>(base, entry.offset).MutableMap();

  const uint32_t saved_tag = data.tag();

  while (true) {
    NodeBase* node = map.AllocNode(map_info.node_size_info);

    InitializeMapNodeEntry(node->GetVoidKey(), map_info.key_type_card, map, aux,
                           true);
    InitializeMapNodeEntry(node->GetVoidValue(map_info.node_size_info),
                           map_info.value_type_card, map, aux, false);

    ptr = ctx->ParseLengthDelimitedInlined(ptr, [&](const char* ptr) {
      return ParseOneMapEntry(node, ptr, ctx, aux, table, entry, map.arena());
    });

    if (PROTOBUF_PREDICT_TRUE(ptr != nullptr)) {
      if (PROTOBUF_PREDICT_FALSE(map_info.value_is_validated_enum &&
                                 !internal::ValidateEnumInlined(
                                     *static_cast<int32_t*>(node->GetVoidValue(
                                         map_info.node_size_info)),
                                     aux[1].enum_data))) {
        WriteMapEntryAsUnknown(msg, table, saved_tag, node, map_info);
      } else {
        // Done parsing the node, try to insert it.
        // If it overwrites something we get old node back to destroy it.
        switch (map_info.key_type_card.cpp_type()) {
          case MapTypeCard::kBool:
            node = static_cast<KeyMapBase<bool>&>(map).InsertOrReplaceNode(
                static_cast<KeyMapBase<bool>::KeyNode*>(node));
            break;
          case MapTypeCard::k32:
            node = static_cast<KeyMapBase<uint32_t>&>(map).InsertOrReplaceNode(
                static_cast<KeyMapBase<uint32_t>::KeyNode*>(node));
            break;
          case MapTypeCard::k64:
            node = static_cast<KeyMapBase<uint64_t>&>(map).InsertOrReplaceNode(
                static_cast<KeyMapBase<uint64_t>::KeyNode*>(node));
            break;
          case MapTypeCard::kString:
            node =
                static_cast<KeyMapBase<std::string>&>(map).InsertOrReplaceNode(
                    static_cast<KeyMapBase<std::string>::KeyNode*>(node));
            break;
          default:
            Unreachable();
        }
      }
    }

    // Destroy the node if we have it.
    // It could be because we failed to parse, or because insertion returned
    // an overwritten node.
    if (PROTOBUF_PREDICT_FALSE(node != nullptr && map.arena() == nullptr)) {
      DestroyMapNode(node, map_info, map);
    }

    if (PROTOBUF_PREDICT_FALSE(ptr == nullptr)) {
      PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
    }

    if (PROTOBUF_PREDICT_FALSE(!ctx->DataAvailable(ptr))) {
      PROTOBUF_MUSTTAIL return ToParseLoop(PROTOBUF_TC_PARAM_NO_DATA_PASS);
    }

    uint32_t next_tag;
    const char* ptr2 = ReadTagInlined(ptr, &next_tag);
    if (next_tag != saved_tag) break;
    ptr = ptr2;
  }

  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}